

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterInvocationTestCase::
genBarrierSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  ostringstream buf;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  if (*(char *)((long)this + 0x7e) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aoStack_188,"\tgroupMemoryBarrier();\n",0x17);
    lVar2 = 0xc;
    pcVar3 = "\tbarrier();\n";
LAB_0048e296:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,pcVar3,lVar2);
  }
  else if (*(int *)((long)this + 0x78) != 0) {
    if (*(int *)((long)this + 0x78) != 1) goto LAB_0048e2b2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
    lVar2 = 0x17;
    pcVar3 = "\tmemoryBarrierImage();\n";
    goto LAB_0048e296;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_188,"\n",1);
LAB_0048e2b2:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  psVar1 = (string *)std::ios_base::~ios_base(local_118);
  return psVar1;
}

Assistant:

std::string InterInvocationTestCase::genBarrierSource (void) const
{
	std::ostringstream buf;

	if (m_syncWithGroup)
	{
		// Wait until all invocations in this work group have their texture/buffer read/write operations complete
		// \note We could also use memoryBarrierBuffer() or memoryBarrierImage() in place of groupMemoryBarrier() but
		//       we only require intra-workgroup synchronization.
		buf << "\n"
			<< "	groupMemoryBarrier();\n"
			<< "	barrier();\n"
			<< "\n";
	}
	else if (m_storage == STORAGE_BUFFER)
	{
		DE_ASSERT(!m_syncWithGroup);

		// Waiting only for data written by this invocation. Since all buffer reads and writes are
		// processed in order (within a single invocation), we don't have to do anything.
		buf << "\n";
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		DE_ASSERT(!m_syncWithGroup);

		// Waiting only for data written by this invocation. But since operations complete in undefined
		// order, we have to wait for them to complete.
		buf << "\n"
			<< "	memoryBarrierImage();\n"
			<< "\n";
	}
	else
		DE_ASSERT(DE_FALSE);

	return buf.str();
}